

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLProgramCache.cpp
# Opt level: O0

bool __thiscall
Diligent::GLProgramCache::ProgramCacheKey::operator==(ProgramCacheKey *this,ProgramCacheKey *Key)

{
  bool bVar1;
  bool local_2b;
  bool local_19;
  ProgramCacheKey *Key_local;
  ProgramCacheKey *this_local;
  
  local_19 = false;
  if ((this->Hash == Key->Hash) &&
     (local_19 = false, (this->IsSeparableProgram & 1U) == (Key->IsSeparableProgram & 1U))) {
    bVar1 = std::operator==(&this->ShaderUIDs,&Key->ShaderUIDs);
    local_19 = false;
    if (bVar1) {
      bVar1 = std::operator==(&this->SignaturUIDs,&Key->SignaturUIDs);
      local_19 = false;
      if (bVar1) {
        bVar1 = std::vector<int,_std::allocator<int>_>::empty(&this->SignaturUIDs);
        local_2b = true;
        if (bVar1) {
          local_2b = PipelineResourceLayoutDesc::operator==
                               (&(this->ResourceLayout).super_PipelineResourceLayoutDesc,
                                &(Key->ResourceLayout).super_PipelineResourceLayoutDesc);
        }
        local_19 = local_2b;
      }
    }
  }
  return local_19;
}

Assistant:

bool GLProgramCache::ProgramCacheKey::operator==(const ProgramCacheKey& Key) const noexcept
{
    // clang-format off
    return (Hash               == Key.Hash               &&
            IsSeparableProgram == Key.IsSeparableProgram &&
            ShaderUIDs         == Key.ShaderUIDs         &&
            SignaturUIDs       == Key.SignaturUIDs       &&
            (!SignaturUIDs.empty() || ResourceLayout == Key.ResourceLayout));
    // clang-format on
}